

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv4.c
# Opt level: O0

int lrtr_ipv4_addr_to_str(lrtr_ipv4_addr *ip,char *str,uint len)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  uint len_local;
  char *str_local;
  lrtr_ipv4_addr *ip_local;
  uint8_t buff [4];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = snprintf(str,(ulong)len,"%hhu.%hhu.%hhu.%hhu",(ulong)(byte)(ip->addr >> 0x18),
                   (ulong)(byte)(ip->addr >> 0x10),(ulong)(byte)(ip->addr >> 8),ip->addr & 0xff);
  if (iVar2 < 0) {
    ip_local._0_4_ = -1;
  }
  else {
    ip_local._0_4_ = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)ip_local;
  }
  __stack_chk_fail();
}

Assistant:

int lrtr_ipv4_addr_to_str(const struct lrtr_ipv4_addr *ip, char *str, unsigned int len)
{
	uint8_t buff[4];

	buff[0] = ip->addr >> 24 & 0xff;
	buff[1] = ip->addr >> 16 & 0xff;
	buff[2] = ip->addr >> 8 & 0xff;
	buff[3] = ip->addr & 0xff;

	if (snprintf(str, len, "%hhu.%hhu.%hhu.%hhu", buff[0], buff[1], buff[2], buff[3]) < 0)
		return -1;

	return 0;
}